

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressInRegister.cpp
# Opt level: O0

Expression * __thiscall IRT::AddressInRegister::ToExpression(AddressInRegister *this)

{
  TempExpression *this_00;
  Temporary local_30;
  AddressInRegister *local_10;
  AddressInRegister *this_local;
  
  local_10 = this;
  this_00 = (TempExpression *)operator_new(0x28);
  Temporary::Temporary(&local_30,&this->temp_);
  TempExpression::TempExpression(this_00,&local_30);
  Temporary::~Temporary(&local_30);
  return &this_00->super_Expression;
}

Assistant:

Expression* AddressInRegister::ToExpression() {
  return new TempExpression(temp_);
}